

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_set_session(mbedtls_ssl_context *ssl,mbedtls_ssl_session *session)

{
  int ret;
  mbedtls_ssl_session *session_local;
  mbedtls_ssl_context *ssl_local;
  
  if ((((ssl == (mbedtls_ssl_context *)0x0) || (session == (mbedtls_ssl_session *)0x0)) ||
      (ssl->session_negotiate == (mbedtls_ssl_session *)0x0)) || (ssl->conf->endpoint != '\0')) {
    ssl_local._4_4_ = -0x7100;
  }
  else if (ssl->handshake->resume == '\x01') {
    ssl_local._4_4_ = -0x7080;
  }
  else {
    ssl_local._4_4_ = mbedtls_ssl_session_copy(ssl->session_negotiate,session);
    if (ssl_local._4_4_ == 0) {
      ssl->handshake->resume = '\x01';
      ssl_local._4_4_ = 0;
    }
  }
  return ssl_local._4_4_;
}

Assistant:

int mbedtls_ssl_set_session(mbedtls_ssl_context *ssl, const mbedtls_ssl_session *session)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    if (ssl == NULL ||
        session == NULL ||
        ssl->session_negotiate == NULL ||
        ssl->conf->endpoint != MBEDTLS_SSL_IS_CLIENT) {
        return MBEDTLS_ERR_SSL_BAD_INPUT_DATA;
    }

    if (ssl->handshake->resume == 1) {
        return MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE;
    }

#if defined(MBEDTLS_SSL_PROTO_TLS1_3)
    if (session->tls_version == MBEDTLS_SSL_VERSION_TLS1_3) {
        const mbedtls_ssl_ciphersuite_t *ciphersuite_info =
            mbedtls_ssl_ciphersuite_from_id(session->ciphersuite);

        if (mbedtls_ssl_validate_ciphersuite(
                ssl, ciphersuite_info, MBEDTLS_SSL_VERSION_TLS1_3,
                MBEDTLS_SSL_VERSION_TLS1_3) != 0) {
            MBEDTLS_SSL_DEBUG_MSG(4, ("%d is not a valid TLS 1.3 ciphersuite.",
                                      session->ciphersuite));
            return MBEDTLS_ERR_SSL_BAD_INPUT_DATA;
        }
    }
#endif /* MBEDTLS_SSL_PROTO_TLS1_3 */

    if ((ret = mbedtls_ssl_session_copy(ssl->session_negotiate,
                                        session)) != 0) {
        return ret;
    }

    ssl->handshake->resume = 1;

    return 0;
}